

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingDirectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDirectionSyntax,slang::parsing::Token&,slang::syntax::ClockingSkewSyntax*&,slang::parsing::Token&,slang::syntax::ClockingSkewSyntax*&>
          (BumpAllocator *this,Token *args,ClockingSkewSyntax **args_1,Token *args_2,
          ClockingSkewSyntax **args_3)

{
  Token input;
  Token output;
  ClockingDirectionSyntax *this_00;
  ClockingSkewSyntax **args_local_3;
  Token *args_local_2;
  ClockingSkewSyntax **args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ClockingDirectionSyntax *)allocate(this,0x40,8);
  input.kind = args->kind;
  input._2_1_ = args->field_0x2;
  input.numFlags.raw = (args->numFlags).raw;
  input.rawLen = args->rawLen;
  input.info = args->info;
  output.kind = args_2->kind;
  output._2_1_ = args_2->field_0x2;
  output.numFlags.raw = (args_2->numFlags).raw;
  output.rawLen = args_2->rawLen;
  output.info = args_2->info;
  slang::syntax::ClockingDirectionSyntax::ClockingDirectionSyntax
            (this_00,input,*args_1,output,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }